

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O2

void __thiscall miniros::ServicePublication::dropAllConnections(ServicePublication *this)

{
  __shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  local_links;
  ServiceClientLinkPtr link;
  
  local_links.
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_links.
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_links.
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::mutex::lock(&this->client_links_mutex_);
  p_Var2 = &((this->client_links_).
             super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>;
  p_Var1 = &((this->client_links_).
             super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>;
  local_links.
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->client_links_).
       super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->client_links_).
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->client_links_).
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->client_links_).
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_links.
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2;
  local_links.
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->client_links_mutex_);
  for (; p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&link.super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>,
               p_Var2);
    Connection::drop(((link.
                       super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->connection_).
                     super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     Destructing);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&link.super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ::~vector(&local_links);
  return;
}

Assistant:

void ServicePublication::dropAllConnections()
{
  // Swap our client_links_ list with a local one so we can only lock for a short period of time, because a
  // side effect of our calling drop() on connections can be re-locking the client_links_ mutex
  std::vector<ServiceClientLinkPtr> local_links;

  {
    std::scoped_lock<std::mutex> lock(client_links_mutex_);
    local_links.swap(client_links_);
  }

  for (ServiceClientLinkPtr link: local_links)
    link->getConnection()->drop(Connection::Destructing);
}